

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::rescalePartialsByPartition
          (BeagleCPUImpl<double,_1,_0> *this,double *destP,double *scaleFactors,
          double *cumulativeScaleFactors,int fillWithOnes,int partitionIndex)

{
  int iVar1;
  int iVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R9D;
  double dVar3;
  double logMax;
  int i_1;
  int offset_1;
  int l_1;
  double oneOverMax;
  int i;
  int offset;
  int l;
  int patternOffset;
  double max;
  int k;
  int endPattern;
  int startPattern;
  int local_64;
  int local_60;
  int local_5c;
  int local_50;
  int local_4c;
  int local_48;
  double local_40;
  int local_34;
  
  iVar1 = *(int *)(*(long *)(in_RDI + 0x90) + (long)(in_R9D + 1) * 4);
  for (local_34 = *(int *)(*(long *)(in_RDI + 0x90) + (long)in_R9D * 4); local_34 < iVar1;
      local_34 = local_34 + 1) {
    local_40 = 0.0;
    iVar2 = local_34 * *(int *)(in_RDI + 0x2c);
    for (local_48 = 0; local_48 < *(int *)(in_RDI + 0x34); local_48 = local_48 + 1) {
      local_4c = local_48 * *(int *)(in_RDI + 0x18) * *(int *)(in_RDI + 0x2c) + iVar2;
      for (local_50 = 0; local_50 < *(int *)(in_RDI + 0x24); local_50 = local_50 + 1) {
        if (local_40 < *(double *)(in_RSI + (long)local_4c * 8)) {
          local_40 = *(double *)(in_RSI + (long)local_4c * 8);
        }
        local_4c = local_4c + 1;
      }
    }
    if ((local_40 == 0.0) && (!NAN(local_40))) {
      local_40 = 1.0;
    }
    for (local_5c = 0; local_5c < *(int *)(in_RDI + 0x34); local_5c = local_5c + 1) {
      local_60 = local_5c * *(int *)(in_RDI + 0x18) * *(int *)(in_RDI + 0x2c) + iVar2;
      for (local_64 = 0; local_64 < *(int *)(in_RDI + 0x24); local_64 = local_64 + 1) {
        *(double *)(in_RSI + (long)local_60 * 8) =
             (1.0 / local_40) * *(double *)(in_RSI + (long)local_60 * 8);
        local_60 = local_60 + 1;
      }
    }
    if ((*(ulong *)(in_RDI + 0x58) & 0x400) == 0) {
      *(double *)(in_RDX + (long)local_34 * 8) = local_40;
      if (in_RCX != 0) {
        dVar3 = log(local_40);
        *(double *)(in_RCX + (long)local_34 * 8) = dVar3 + *(double *)(in_RCX + (long)local_34 * 8);
      }
    }
    else {
      dVar3 = log(local_40);
      *(double *)(in_RDX + (long)local_34 * 8) = dVar3;
      if (in_RCX != 0) {
        *(double *)(in_RCX + (long)local_34 * 8) = dVar3 + *(double *)(in_RCX + (long)local_34 * 8);
      }
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::rescalePartialsByPartition(REALTYPE* destP,
                                                                   REALTYPE* scaleFactors,
                                                                   REALTYPE* cumulativeScaleFactors,
                                                                   const int fillWithOnes,
                                                                   const int partitionIndex) {

    int startPattern = gPatternPartitionsStartPatterns[partitionIndex];
    int endPattern = gPatternPartitionsStartPatterns[partitionIndex + 1];

    // TODO None of the code below has been optimized.
    for (int k = startPattern; k < endPattern; k++) {
        REALTYPE max = 0;
        const int patternOffset = k * kPartialsPaddedStateCount;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
        }

        if (max == 0)
            max = 1.0;

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++)
                destP[offset++] *= oneOverMax;
        }

        if (kFlags & BEAGLE_FLAG_SCALERS_LOG) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
}